

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rownumber_function.cpp
# Opt level: O0

void __thiscall
duckdb::WindowRowNumberExecutor::WindowRowNumberExecutor
          (WindowRowNumberExecutor *this,BoundWindowExpression *wexpr,ClientContext *context,
          WindowSharedExpressions *shared)

{
  bool bVar1;
  long in_RSI;
  unsigned_long *in_RDI;
  BoundOrderByNode *order;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::BoundOrderByNode,_true> *__range1;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  *in_stack_ffffffffffffff88;
  WindowSharedExpressions *in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  WindowSharedExpressions *in_stack_ffffffffffffffa8;
  ClientContext *in_stack_ffffffffffffffb0;
  BoundWindowExpression *in_stack_ffffffffffffffb8;
  WindowExecutor *in_stack_ffffffffffffffc0;
  __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
  local_30;
  long local_28;
  long local_10;
  
  local_10 = in_RSI;
  WindowExecutor::WindowExecutor
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  *in_RDI = (unsigned_long)&PTR__WindowRowNumberExecutor_03535130;
  in_RDI[7] = 0xffffffffffffffff;
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8);
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x1a4216f);
  local_28 = local_10 + 0xf8;
  local_30._M_current =
       (BoundOrderByNode *)
       ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::begin
                 (in_stack_ffffffffffffff88);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::end
            (in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
    ::operator*(&local_30);
    in_stack_ffffffffffffff88 =
         (vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)(in_RDI + 8)
    ;
    in_stack_ffffffffffffff90 =
         (WindowSharedExpressions *)
         WindowSharedExpressions::RegisterSink
                   (in_stack_ffffffffffffff90,
                    (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )in_stack_ffffffffffffff88);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (this_00,in_RDI);
    __gnu_cxx::
    __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

WindowRowNumberExecutor::WindowRowNumberExecutor(BoundWindowExpression &wexpr, ClientContext &context,
                                                 WindowSharedExpressions &shared)
    : WindowExecutor(wexpr, context, shared) {

	for (const auto &order : wexpr.arg_orders) {
		arg_order_idx.emplace_back(shared.RegisterSink(order.expression));
	}
}